

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O2

RecyclerWeakReference<Js::Type> * __thiscall
JsUtil::WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>::
Insert(WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true> *this,
      RecyclerWeakReference<Js::Type> *weakRef,bool value,int hash,uint bucket)

{
  WeakRefDictionaryEntry<Js::Type,_bool> *pWVar1;
  bool bVar2;
  int iVar3;
  
  if (this->freeCount < 1) {
    iVar3 = this->count;
    if (iVar3 == this->size) {
      bVar2 = Clean(this);
      if (bVar2) {
        iVar3 = this->freeList;
        this->freeList = (this->entries).ptr[iVar3].next;
        this->freeCount = this->freeCount + -1;
      }
      else {
        Resize(this);
        bucket = PrimePolicy::ModPrime(hash,this->size,this->modFunctionIndex);
        iVar3 = this->count;
        this->count = iVar3 + 1;
      }
    }
    else {
      this->count = iVar3 + 1;
    }
  }
  else {
    iVar3 = this->freeList;
    this->freeList = (this->entries).ptr[iVar3].next;
    this->freeCount = this->freeCount + -1;
  }
  pWVar1 = (this->entries).ptr;
  pWVar1[iVar3].next = (this->buckets).ptr[bucket];
  Memory::WriteBarrierPtr<const_Memory::RecyclerWeakReference<Js::Type>_>::WriteBarrierSet
            (&pWVar1[iVar3].key,weakRef);
  pWVar1 = (this->entries).ptr;
  pWVar1[iVar3].hash = hash;
  pWVar1[iVar3].value = value;
  (this->buckets).ptr[bucket] = iVar3;
  this->version = this->version + 1;
  return pWVar1[iVar3].key.ptr;
}

Assistant:

const RecyclerWeakReference<TKey>* Insert(const RecyclerWeakReference<TKey>* weakRef, TValue value, int hash, uint bucket)
        {
            int index;
            if (freeCount > 0)
            {
                index = freeList;
                freeList = entries[index].next;
                freeCount--;
            }
            else
            {
                if (count == size)
                {
                    if (cleanOnInsert && Clean())
                    {
                        index = freeList;
                        freeList = entries[index].next;
                        freeCount--;
                    }
                    else
                    {
                        Resize();
                        bucket = PrimePolicy::GetBucket(hash, size, modFunctionIndex);
                        index = count;
                        count++;
                    }
                }
                else
                {
                    index = count;
                    count++;
                }
            }

            entries[index].next = buckets[bucket];
            entries[index].key = weakRef;
            entries[index].hash = hash;
            entries[index].value = value;
            buckets[bucket] = index;
            version++;

            return entries[index].key;
        }